

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

format_arg * __thiscall
fmt::v5::internal::
context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
::do_get_arg(format_arg *__return_storage_ptr__,
            context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
            *this,uint arg_id)

{
  format_arg *this_00;
  
  this_00 = __return_storage_ptr__;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  ::get(__return_storage_ptr__,&this->args_,arg_id);
  if (__return_storage_ptr__->type_ != none_type) {
    return __return_storage_ptr__;
  }
  error_handler::on_error((error_handler *)this_00,"argument index out of range");
}

Assistant:

format_arg do_get_arg(unsigned arg_id) {
    format_arg arg = args_.get(arg_id);
    if (!arg)
      parse_context_.on_error("argument index out of range");
    return arg;
  }